

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

int Curl_conn_get_stream_error(Curl_easy *data,connectdata *conn,int sockindex)

{
  Curl_cfilter *pCVar1;
  int local_38;
  CURLcode local_34;
  Curl_cfilter *cf;
  int n;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cf._4_4_ = 0;
  pCVar1 = conn->cfilter[sockindex];
  if (pCVar1 == (Curl_cfilter *)0x0) {
    local_34 = CURLE_UNKNOWN_OPTION;
  }
  else {
    n = sockindex;
    _result = conn;
    conn_local = (connectdata *)data;
    local_34 = (*pCVar1->cft->query)(pCVar1,data,6,(int *)((long)&cf + 4),(void *)0x0);
  }
  if ((local_34 == CURLE_OK) && (-1 < cf._4_4_)) {
    local_38 = cf._4_4_;
  }
  else {
    local_38 = 0;
  }
  return local_38;
}

Assistant:

int Curl_conn_get_stream_error(struct Curl_easy *data,
                               struct connectdata *conn,
                               int sockindex)
{
  CURLcode result;
  int n = 0;

  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  result = cf ? cf->cft->query(cf, data, CF_QUERY_STREAM_ERROR,
                               &n, NULL) : CURLE_UNKNOWN_OPTION;
  return (result || n < 0) ? 0 : n;
}